

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshints.c
# Opt level: O0

void cf2_hint_init(CF2_Hint hint,CF2_ArrStack stemHintArray,size_t indexStemHint,CF2_Font font,
                  CF2_F16Dot16 hintOrigin,CF2_F16Dot16 scale,FT_Bool bottom)

{
  FT_Bool FVar1;
  int iVar2;
  FT_Int32 FVar3;
  char *pcVar4;
  CF2_StemHintRec *stemHint;
  CF2_F16Dot16 width;
  CF2_F16Dot16 scale_local;
  CF2_F16Dot16 hintOrigin_local;
  CF2_Font font_local;
  size_t indexStemHint_local;
  CF2_ArrStack stemHintArray_local;
  CF2_Hint hint_local;
  
  memset(hint,0,0x20);
  pcVar4 = (char *)cf2_arrstack_getPointer(stemHintArray,indexStemHint);
  iVar2 = *(int *)(pcVar4 + 8) - *(int *)(pcVar4 + 4);
  if (iVar2 == -0x150000) {
    if (bottom == '\0') {
      hint->flags = 0;
    }
    else {
      hint->csCoord = *(CF2_F16Dot16 *)(pcVar4 + 8);
      hint->flags = 1;
    }
  }
  else if (iVar2 == -0x140000) {
    if (bottom == '\0') {
      hint->csCoord = *(CF2_F16Dot16 *)(pcVar4 + 4);
      hint->flags = 2;
    }
    else {
      hint->flags = 0;
    }
  }
  else if (iVar2 < 0) {
    if (bottom == '\0') {
      hint->csCoord = *(CF2_F16Dot16 *)(pcVar4 + 4);
      hint->flags = 8;
    }
    else {
      hint->csCoord = *(CF2_F16Dot16 *)(pcVar4 + 8);
      hint->flags = 4;
    }
  }
  else if (bottom == '\0') {
    hint->csCoord = *(CF2_F16Dot16 *)(pcVar4 + 8);
    hint->flags = 8;
  }
  else {
    hint->csCoord = *(CF2_F16Dot16 *)(pcVar4 + 4);
    hint->flags = 4;
  }
  FVar1 = cf2_hint_isTop(hint);
  if (FVar1 != '\0') {
    hint->csCoord = hint->csCoord + font->darkenY * 2;
  }
  hint->csCoord = hint->csCoord + hintOrigin;
  hint->scale = scale;
  hint->index = indexStemHint;
  if ((hint->flags == 0) || (*pcVar4 == '\0')) {
    FVar3 = FT_MulFix_x86_64(hint->csCoord,scale);
    hint->dsCoord = FVar3;
  }
  else {
    FVar1 = cf2_hint_isTop(hint);
    if (FVar1 == '\0') {
      hint->dsCoord = *(CF2_F16Dot16 *)(pcVar4 + 0xc);
    }
    else {
      hint->dsCoord = *(CF2_F16Dot16 *)(pcVar4 + 0x10);
    }
    cf2_hint_lock(hint);
  }
  return;
}

Assistant:

static void
  cf2_hint_init( CF2_Hint            hint,
                 const CF2_ArrStack  stemHintArray,
                 size_t              indexStemHint,
                 const CF2_Font      font,
                 CF2_Fixed           hintOrigin,
                 CF2_Fixed           scale,
                 FT_Bool             bottom )
  {
    CF2_Fixed               width;
    const CF2_StemHintRec*  stemHint;


    FT_ZERO( hint );

    stemHint = (const CF2_StemHintRec*)cf2_arrstack_getPointer(
                                         stemHintArray,
                                         indexStemHint );

    width = SUB_INT32( stemHint->max, stemHint->min );

    if ( width == cf2_intToFixed( -21 ) )
    {
      /* ghost bottom */

      if ( bottom )
      {
        hint->csCoord = stemHint->max;
        hint->flags   = CF2_GhostBottom;
      }
      else
        hint->flags = 0;
    }

    else if ( width == cf2_intToFixed( -20 ) )
    {
      /* ghost top */

      if ( bottom )
        hint->flags = 0;
      else
      {
        hint->csCoord = stemHint->min;
        hint->flags   = CF2_GhostTop;
      }
    }

    else if ( width < 0 )
    {
      /* inverted pair */

      /*
       * Hints with negative widths were produced by an early version of a
       * non-Adobe font tool.  The Type 2 spec allows edge (ghost) hints
       * with negative widths, but says
       *
       *   All other negative widths have undefined meaning.
       *
       * CoolType has a silent workaround that negates the hint width; for
       * permissive mode, we do the same here.
       *
       * Note: Such fonts cannot use ghost hints, but should otherwise work.
       * Note: Some poor hints in our faux fonts can produce negative
       *       widths at some blends.  For example, see a light weight of
       *       `u' in ASerifMM.
       *
       */
      if ( bottom )
      {
        hint->csCoord = stemHint->max;
        hint->flags   = CF2_PairBottom;
      }
      else
      {
        hint->csCoord = stemHint->min;
        hint->flags   = CF2_PairTop;
      }
    }

    else
    {
      /* normal pair */

      if ( bottom )
      {
        hint->csCoord = stemHint->min;
        hint->flags   = CF2_PairBottom;
      }
      else
      {
        hint->csCoord = stemHint->max;
        hint->flags   = CF2_PairTop;
      }
    }

    /* Now that ghost hints have been detected, adjust this edge for      */
    /* darkening.  Bottoms are not changed; tops are incremented by twice */
    /* `darkenY'.                                                         */
    if ( cf2_hint_isTop( hint ) )
      hint->csCoord = ADD_INT32( hint->csCoord, 2 * font->darkenY );

    hint->csCoord = ADD_INT32( hint->csCoord, hintOrigin );
    hint->scale   = scale;
    hint->index   = indexStemHint;   /* index in original stem hint array */

    /* if original stem hint has been used, use the same position */
    if ( hint->flags != 0 && stemHint->used )
    {
      if ( cf2_hint_isTop( hint ) )
        hint->dsCoord = stemHint->maxDS;
      else
        hint->dsCoord = stemHint->minDS;

      cf2_hint_lock( hint );
    }
    else
      hint->dsCoord = FT_MulFix( hint->csCoord, scale );
  }